

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O2

bool __thiscall
cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
          (ElementsAddressFactory *this,ElementsConfidentialAddress *conf_addr,NetType net_type)

{
  bool bVar1;
  Address local_190 [376];
  
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  bVar1 = AddressFactory::CheckAddressNetType(&this->super_AddressFactory,local_190,net_type);
  core::Address::~Address(local_190);
  return bVar1;
}

Assistant:

bool ElementsAddressFactory::CheckConfidentialAddressNetType(
    const ElementsConfidentialAddress& conf_addr, NetType net_type) const {
  return CheckAddressNetType(conf_addr.GetUnblindedAddress(), net_type);
}